

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# functionals.c
# Opt level: O0

int xc_functional_get_number(char *name)

{
  int iVar1;
  char *in_RDI;
  char *p;
  int key;
  int ii;
  char *local_18;
  int local_c;
  
  iVar1 = strncasecmp(in_RDI,"XC_",3);
  local_18 = in_RDI;
  if (iVar1 == 0) {
    local_18 = in_RDI + 3;
  }
  local_c = 0;
  while( true ) {
    if (xc_functional_keys[local_c].number == -1) {
      return -1;
    }
    iVar1 = strcasecmp(xc_functional_keys[local_c].name,local_18);
    if (iVar1 == 0) break;
    local_c = local_c + 1;
  }
  return xc_functional_keys[local_c].number;
}

Assistant:

int xc_functional_get_number(const char *name)
{
  int ii;
  int key=-1;
  const char *p;

  /* Does name begin with xc_? */
  if(strncasecmp(name,"XC_",3) == 0) {
    p=name+3;
  } else {
    p=name;
  }

  for(ii=0;;ii++){
    if(xc_functional_keys[ii].number == -1)
      break;
    if(strcasecmp(xc_functional_keys[ii].name, p) == 0){
      key = xc_functional_keys[ii].number;
      break;
    }
  }

  return key;
}